

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void __thiscall llvm::sys::fs::TempFile::TempFile(TempFile *this,TempFile *Other)

{
  this->Done = false;
  (this->TmpName)._M_dataplus._M_p = (pointer)&(this->TmpName).field_2;
  (this->TmpName)._M_string_length = 0;
  (this->TmpName).field_2._M_local_buf[0] = '\0';
  this->FD = -1;
  std::__cxx11::string::operator=((string *)&this->TmpName,(string *)&Other->TmpName);
  this->FD = Other->FD;
  Other->Done = true;
  return;
}

Assistant:

TempFile &TempFile::operator=(TempFile &&Other) {
  TmpName = std::move(Other.TmpName);
  FD = Other.FD;
  Other.Done = true;
  return *this;
}